

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFilesForXcode
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *pvVar1;
  cmSourceFile *this_00;
  cmLocalGenerator *this_01;
  bool bVar2;
  reference config;
  reference pbVar3;
  reference ppcVar4;
  ostream *poVar5;
  string *psVar6;
  string local_2c0;
  string local_2a0 [32];
  undefined1 local_280 [8];
  ostringstream e;
  cmSourceFile *f_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3_1;
  string thisConfigFiles;
  cmSourceFile *f;
  iterator __end3;
  iterator __begin3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  char *sep;
  string firstConfigFiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string *firstConfig;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_local;
  cmGeneratorTarget *this_local;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it,this->Makefile,IncludeEmptyConfig);
  firstConfig = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&it);
  config = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&firstConfig);
  GetSourceFilesWithoutObjectLibraries(this,files,config);
  while( true ) {
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&it);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&firstConfig,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&configFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             ((long)&firstConfigFiles.field_2 + 8);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(pvVar1);
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&firstConfig);
    GetSourceFilesWithoutObjectLibraries(this,pvVar1,pbVar3);
    bVar2 = std::operator!=((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            ((long)&firstConfigFiles.field_2 + 8),files);
    if (bVar2) {
      std::__cxx11::string::string((string *)&sep);
      __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0xcbf1b7;
      __end3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(files);
      f = (cmSourceFile *)std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(files);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                    *)&f);
        if (!bVar2) break;
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end3);
        thisConfigFiles.field_2._8_8_ = *ppcVar4;
        std::__cxx11::string::operator+=((string *)&sep,(char *)__range3);
        psVar6 = cmSourceFile::ResolveFullPath
                           ((cmSourceFile *)thisConfigFiles.field_2._8_8_,(string *)0x0,
                            (string *)0x0);
        std::__cxx11::string::operator+=((string *)&sep,(string *)psVar6);
        __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0xc6f833;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::string((string *)&__range3_1);
      __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0xcbf1b7;
      pvVar1 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               ((long)&firstConfigFiles.field_2 + 8);
      __end3_1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pvVar1);
      f_1 = (cmSourceFile *)
            std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pvVar1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&f_1);
        if (!bVar2) break;
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end3_1);
        this_00 = *ppcVar4;
        std::__cxx11::string::operator+=((string *)&__range3_1,(char *)__range3);
        psVar6 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
        std::__cxx11::string::operator+=((string *)&__range3_1,(string *)psVar6);
        __range3 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)0xc6f833;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3_1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
      poVar5 = std::operator<<((ostream *)local_280,"Target \"");
      psVar6 = GetName_abi_cxx11_(this);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,
                               "\" has source files which vary by configuration. This is not supported by the \""
                              );
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_2a0);
      poVar5 = std::operator<<(poVar5,local_2a0);
      poVar5 = std::operator<<(poVar5,"\" generator.\nConfig \"");
      poVar5 = std::operator<<(poVar5,(string *)config);
      poVar5 = std::operator<<(poVar5,"\":\n  ");
      poVar5 = std::operator<<(poVar5,(string *)&sep);
      poVar5 = std::operator<<(poVar5,"\nConfig \"");
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&firstConfig);
      poVar5 = std::operator<<(poVar5,(string *)pbVar3);
      poVar5 = std::operator<<(poVar5,"\":\n  ");
      poVar5 = std::operator<<(poVar5,(string *)&__range3_1);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string(local_2a0);
      this_01 = this->LocalGenerator;
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(this_01,FATAL_ERROR,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      this_local._7_1_ = 0;
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
      std::__cxx11::string::~string((string *)&__range3_1);
      std::__cxx11::string::~string((string *)&sep);
    }
    else {
      bVar2 = false;
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               ((long)&firstConfigFiles.field_2 + 8));
    if (bVar2) goto LAB_007590a3;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&firstConfig);
  }
  this_local._7_1_ = 1;
LAB_007590a3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFilesForXcode(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> const& configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}